

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::ConcatenateColumns::backward_impl
          (ConcatenateColumns *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  int c;
  int d;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> dEdx;
  MatrixBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_true>_>
  *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Index in_stack_ffffffffffffff60;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff68;
  
  Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Eigen::MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0> *)
       0x4eaf76);
  Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  middleCols<int>(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator+=
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  return;
}

Assistant:

void ConcatenateColumns::backward_impl(const vector<const Tensor*>& xs,
                                    const Tensor& fx,
                                    const Tensor& dEdf,
                                    unsigned i,
                                    Tensor& dEdxi) const {
#if HAVE_CUDA
  const unsigned rows = dEdxi.d.rows();
  const unsigned begin = i*rows;
  CUBLAS_CHECK(cublasSaxpy(cublas_handle, rows, kSCALAR_ONE, &dEdf.v[begin], 1, dEdxi.v, 1));
#else
  auto dEdx = *dEdxi;
  int d = dEdx.cols();
  int c = static_cast<unsigned*>(aux_mem)[i];
  dEdx += (*dEdf).middleCols(c, d);
#endif
}